

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# duration.cc
# Opt level: O2

uint128 absl::anon_unknown_0::MakeU128(int64_t a)

{
  uint128 uVar1;
  uint128 local_28;
  
  local_28.lo_ = 0;
  local_28.hi_ = 0;
  if (a < 0) {
    uint128::operator++(&local_28);
    a = ~a;
  }
  else {
    local_28.hi_ = 0;
    local_28.lo_ = 0;
  }
  uVar1.lo_ = local_28.lo_ + a;
  uVar1.hi_ = local_28.hi_ + CARRY8(local_28.lo_,a);
  return uVar1;
}

Assistant:

inline uint128 MakeU128(int64_t a) {
  uint128 u128 = 0;
  if (a < 0) {
    ++u128;
    ++a;  // Makes it safe to negate 'a'
    a = -a;
  }
  u128 += static_cast<uint64_t>(a);
  return u128;
}